

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

void __thiscall llama_model_loader::done_getting_tensors(llama_model_loader *this)

{
  runtime_error *this_00;
  long in_RDI;
  string local_28 [40];
  
  if (*(int *)(in_RDI + 8) != *(int *)(in_RDI + 4)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((char *)local_28,"%s: wrong number of tensors; expected %d, got %d",
                      "done_getting_tensors",(ulong)*(uint *)(in_RDI + 4),
                      (ulong)*(uint *)(in_RDI + 8));
    std::runtime_error::runtime_error(this_00,local_28);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void llama_model_loader::done_getting_tensors() const {
    if (n_created != n_tensors) {
        throw std::runtime_error(format("%s: wrong number of tensors; expected %d, got %d", __func__, n_tensors, n_created));
    }
}